

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_peaks.cpp
# Opt level: O3

void trt_pose::parse::find_peaks_out_hw
               (int *counts,int *peaks,float *input,int H,int W,int M,float threshold,
               int window_size)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  float *pfVar18;
  ulong uVar19;
  
  iVar15 = 0;
  if (0 < M && 0 < H) {
    iVar5 = window_size / 2;
    uVar6 = (ulong)(uint)W;
    uVar14 = 0;
    iVar15 = 0;
    uVar8 = -iVar5;
    do {
      uVar19 = 0;
      if (0 < (int)uVar8) {
        uVar19 = (ulong)uVar8;
      }
      if (0 < W) {
        iVar17 = (int)uVar14;
        iVar1 = iVar17 - iVar5;
        if (iVar17 - iVar5 < 1) {
          iVar1 = 0;
        }
        uVar7 = iVar5 + 1 + iVar17;
        if (H <= (int)uVar7) {
          uVar7 = H;
        }
        lVar10 = 0;
        uVar4 = -iVar5;
        do {
          uVar11 = 0;
          if (0 < (int)uVar4) {
            uVar11 = (ulong)uVar4;
          }
          if (threshold <= input[uVar14 * uVar6 + lVar10]) {
            iVar9 = (int)lVar10;
            if (iVar1 < (int)uVar7) {
              uVar16 = iVar5 + 1 + iVar9;
              if (W <= (int)uVar16) {
                uVar16 = W;
              }
              iVar2 = iVar9 - iVar5;
              if (iVar9 - iVar5 < 1) {
                iVar2 = 0;
              }
              bVar3 = true;
              uVar12 = uVar19;
              pfVar18 = (float *)(uVar6 * 4 * uVar19 + (long)input);
              do {
                uVar13 = uVar11;
                if (iVar2 < (int)uVar16) {
                  do {
                    bVar3 = (bool)(bVar3 & pfVar18[uVar13] <= input[uVar14 * uVar6 + lVar10]);
                    uVar13 = uVar13 + 1;
                  } while (uVar13 < uVar16);
                }
                uVar12 = uVar12 + 1;
                pfVar18 = pfVar18 + uVar6;
              } while (uVar12 < uVar7);
              if (!bVar3) goto LAB_00102643;
            }
            peaks[iVar15 * 2] = iVar17;
            peaks[iVar15 * 2 + 1] = iVar9;
            iVar15 = iVar15 + 1;
          }
LAB_00102643:
          lVar10 = lVar10 + 1;
        } while ((lVar10 < W) && (uVar4 = uVar4 + 1, iVar15 < M));
      }
      uVar14 = uVar14 + 1;
    } while ((uVar14 < (uint)H) && (uVar8 = uVar8 + 1, iVar15 < M));
  }
  *counts = iVar15;
  return;
}

Assistant:

void find_peaks_out_hw(int *counts,        // 1
                       int *peaks,         // Mx2
                       const float *input, // HxW
                       const int H, const int W, const int M,
                       const float threshold, const int window_size) {
  int win = window_size / 2;
  int count = 0;

  for (int i = 0; i < H && count < M; i++) {
    for (int j = 0; j < W && count < M; j++) {
      float val = input[i * W + j];

      // skip if below threshold
      if (val < threshold)
        continue;

      // compute window bounds
      int ii_min = MAX(i - win, 0);
      int jj_min = MAX(j - win, 0);
      int ii_max = MIN(i + win + 1, H);
      int jj_max = MIN(j + win + 1, W);

      // search for larger value in window
      bool is_peak = true;
      for (int ii = ii_min; ii < ii_max; ii++) {
        for (int jj = jj_min; jj < jj_max; jj++) {
          if (input[ii * W + jj] > val) {
            is_peak = false;
          }
        }
      }

      // add peak
      if (is_peak) {
        peaks[count * 2] = i;
        peaks[count * 2 + 1] = j;
        count++;
      }
    }
  }

  *counts = count;
}